

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

uint __thiscall Js::FunctionBody::GetStatementStartOffset(FunctionBody *this,uint statementIndex)

{
  SmallSpanSequence *this_00;
  List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *statementMapList;
  StatementMap *pSVar1;
  StatementData local_30;
  StatementData data;
  int index;
  
  if (statementIndex != 0xffffffff) {
    this_00 = (this->m_sourceInfo).pSpanSequence;
    if (this_00 == (SmallSpanSequence *)0x0) {
      data.sourceBegin = statementIndex;
      statementMapList =
           (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            *)FunctionProxy::GetAuxPtrWithLock((FunctionProxy *)this,StatementMaps);
      pSVar1 = GetNextNonSubexpressionStatementMap<JsUtil::List<Js::FunctionBody::StatementMap*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>>
                         (statementMapList,&data.sourceBegin);
      local_30.sourceBegin = (pSVar1->sourceSpan).begin;
    }
    else {
      data = (StatementData)((ulong)(uint)this_00->baseValue << 0x20);
      local_30.sourceBegin = 0;
      local_30.bytecodeBegin = 0;
      SmallSpanSequence::Item(this_00,statementIndex,(SmallSpanSequenceIter *)&data,&local_30);
    }
    return local_30.sourceBegin;
  }
  return 0;
}

Assistant:

uint FunctionBody::GetStatementStartOffset(const uint statementIndex)
    {
        uint startOffset = 0;

        if (statementIndex != Js::Constants::NoStatementIndex)
        {
            const Js::FunctionBody::SourceInfo * sourceInfo = &(this->m_sourceInfo);
            if (sourceInfo->pSpanSequence != nullptr)
            {
                Js::SmallSpanSequenceIter iter;
                sourceInfo->pSpanSequence->Reset(iter);
                Js::StatementData data;
                sourceInfo->pSpanSequence->Item(statementIndex, iter, data);
                startOffset = data.sourceBegin;
            }
            else
            {
                int index = statementIndex;
                Js::FunctionBody::StatementMap * statementMap = GetNextNonSubexpressionStatementMap(GetStatementMaps(), index);
                startOffset = statementMap->sourceSpan.Begin();
            }
        }

        return startOffset;
    }